

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

void RemoveOpenStream(PaStream *stream)

{
  PaUtilStreamRepresentation *current;
  PaUtilStreamRepresentation *previous;
  PaStream *stream_local;
  
  previous = (PaUtilStreamRepresentation *)0x0;
  current = firstOpenStream_;
  while( true ) {
    if (current == (PaUtilStreamRepresentation *)0x0) {
      return;
    }
    if (current == (PaUtilStreamRepresentation *)stream) break;
    previous = current;
    current = current->nextOpenStream;
  }
  if (previous == (PaUtilStreamRepresentation *)0x0) {
    firstOpenStream_ = current->nextOpenStream;
    return;
  }
  previous->nextOpenStream = current->nextOpenStream;
  return;
}

Assistant:

static void RemoveOpenStream( PaStream* stream )
{
    PaUtilStreamRepresentation *previous = NULL;
    PaUtilStreamRepresentation *current = firstOpenStream_;

    while( current != NULL )
    {
        if( ((PaStream*)current) == stream )
        {
            if( previous == NULL )
            {
                firstOpenStream_ = current->nextOpenStream;
            }
            else
            {
                previous->nextOpenStream = current->nextOpenStream;
            }
            return;
        }
        else
        {
            previous = current;
            current = current->nextOpenStream;
        }
    }
}